

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O1

void __thiscall
Fl_Table::get_bounds(Fl_Table *this,TableContext context,int *X,int *Y,int *W,int *H)

{
  int iVar1;
  
  if (context == CONTEXT_ROW_HEADER) {
    *X = this->wix;
    *Y = this->toy;
    *W = this->_row_header_w;
    iVar1 = this->toh;
  }
  else if (context == CONTEXT_TABLE) {
    *X = this->tix;
    *Y = this->tiy;
    *W = this->tiw;
    iVar1 = this->tih;
  }
  else {
    if (context != CONTEXT_COL_HEADER) {
      fprintf(_stderr,"Fl_Table::get_bounds(): context %d unimplemented\n",(ulong)context);
      return;
    }
    *X = this->tox;
    *Y = this->wiy;
    *W = this->tow;
    iVar1 = this->_col_header_h;
  }
  *H = iVar1;
  return;
}

Assistant:

void Fl_Table::get_bounds(TableContext context, int &X, int &Y, int &W, int &H) {
  switch ( context ) {
    case CONTEXT_COL_HEADER:
      // Column header clipping.
      X = tox;
      Y = wiy;
      W = tow;
      H = col_header_height();
      return;
      
    case CONTEXT_ROW_HEADER:
      // Row header clipping.
      X = wix;
      Y = toy;
      W = row_header_width();
      H = toh;
      return;
      
    case CONTEXT_TABLE:
      // Table inner dimensions
      X = tix; Y = tiy; W = tiw; H = tih;
      return;
      
      // TODO: Add other contexts..
    default:
      fprintf(stderr, "Fl_Table::get_bounds(): context %d unimplemented\n", (int)context);
      return;
  }
  //NOTREACHED
}